

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O2

void Nwk_ManMarkTfoCone_rec(Nwk_Obj_t *pObj)

{
  long lVar1;
  
  if ((*(uint *)&pObj->field_0x20 & 0x10) == 0) {
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 | 0x10;
    for (lVar1 = 0;
        ((int)lVar1 < pObj->nFanouts && (pObj->pFanio[pObj->nFanins + lVar1] != (Nwk_Obj_t *)0x0));
        lVar1 = lVar1 + 1) {
      Nwk_ManMarkTfoCone_rec(pObj->pFanio[pObj->nFanins + lVar1]);
    }
  }
  return;
}

Assistant:

void Nwk_ManMarkTfoCone_rec( Nwk_Obj_t * pObj )
{
    Nwk_Obj_t * pNext;
    int i;
    if ( pObj->MarkA )
        return;
    pObj->MarkA = 1;
    Nwk_ObjForEachFanout( pObj, pNext, i )
        Nwk_ManMarkTfoCone_rec( pNext );
}